

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# almalloc.cpp
# Opt level: O3

void al_free(void *ptr)

{
  free(ptr);
  return;
}

Assistant:

void al_free(void *ptr) noexcept
{
#if defined(HAVE_STD_ALIGNED_ALLOC) || defined(HAVE_POSIX_MEMALIGN)
    std::free(ptr);
#elif defined(HAVE__ALIGNED_MALLOC)
    _aligned_free(ptr);
#else
    if(ptr != nullptr)
        std::free(*(static_cast<void**>(ptr) - 1));
#endif
}